

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SparcInstPrinter.c
# Opt level: O0

_Bool printSparcAliasInstr(MCInst *MI,SStream *O)

{
  _Bool _Var1;
  uint uVar2;
  int64_t iVar3;
  MCOperand *pMVar4;
  SStream *O_local;
  MCInst *MI_local;
  
  uVar2 = MCInst_getOpcode(MI);
  if (uVar2 - 299 < 2) {
    uVar2 = MCInst_getNumOperands(MI);
    if (uVar2 == 3) {
      pMVar4 = MCInst_getOperand(MI,0);
      _Var1 = MCOperand_isReg(pMVar4);
      if (_Var1) {
        pMVar4 = MCInst_getOperand(MI,0);
        uVar2 = MCOperand_getReg(pMVar4);
        if (uVar2 == 0x47) {
          pMVar4 = MCInst_getOperand(MI,2);
          _Var1 = MCOperand_isImm(pMVar4);
          if (_Var1) {
            pMVar4 = MCInst_getOperand(MI,2);
            iVar3 = MCOperand_getImm(pMVar4);
            if (iVar3 == 8) {
              pMVar4 = MCInst_getOperand(MI,1);
              uVar2 = MCOperand_getReg(pMVar4);
              if (uVar2 == 0x56) {
                SStream_concat0(O,"ret");
                MCInst_setOpcodePub(MI,0x115);
                return true;
              }
              if (uVar2 == 0x66) {
                SStream_concat0(O,"retl");
                MCInst_setOpcodePub(MI,0x116);
                return true;
              }
            }
          }
          SStream_concat0(O,"jmp\t");
          MCInst_setOpcodePub(MI,0x11);
          printMemOperand(MI,1,O,(char *)0x0);
          MI_local._7_1_ = true;
        }
        else if (uVar2 == 0x66) {
          SStream_concat0(O,"call ");
          MCInst_setOpcodePub(MI,0x1b);
          printMemOperand(MI,1,O,(char *)0x0);
          MI_local._7_1_ = true;
        }
        else {
          MI_local._7_1_ = false;
        }
      }
      else {
        MI_local._7_1_ = false;
      }
    }
    else {
      MI_local._7_1_ = false;
    }
  }
  else if (uVar2 - 0x1d2 < 6) {
    if (((MI->csh->mode & CS_MODE_MICRO) == CS_MODE_ARM) &&
       (uVar2 = MCInst_getNumOperands(MI), uVar2 == 3)) {
      pMVar4 = MCInst_getOperand(MI,0);
      _Var1 = MCOperand_isReg(pMVar4);
      if (_Var1) {
        pMVar4 = MCInst_getOperand(MI,0);
        uVar2 = MCOperand_getReg(pMVar4);
        if (uVar2 == 0x43) {
          uVar2 = MCInst_getOpcode(MI);
          switch(uVar2) {
          case 0x1d2:
            SStream_concat0(O,"fcmpd\t");
            MCInst_setOpcodePub(MI,0x3c);
            break;
          case 0x1d3:
            SStream_concat0(O,"fcmped\t");
            MCInst_setOpcodePub(MI,0x10b);
            break;
          case 0x1d4:
            SStream_concat0(O,"fcmpeq\t");
            MCInst_setOpcodePub(MI,0x10c);
            break;
          case 0x1d5:
            SStream_concat0(O,"fcmpes\t");
            MCInst_setOpcodePub(MI,0x10d);
            break;
          case 0x1d6:
            SStream_concat0(O,"fcmpq\t");
            MCInst_setOpcodePub(MI,0x45);
            break;
          default:
            SStream_concat0(O,"fcmps\t");
            MCInst_setOpcodePub(MI,0x46);
          }
          printOperand(MI,1,O);
          SStream_concat0(O,", ");
          printOperand(MI,2,O);
          return true;
        }
      }
    }
    MI_local._7_1_ = false;
  }
  else {
    MI_local._7_1_ = false;
  }
  return MI_local._7_1_;
}

Assistant:

static bool printSparcAliasInstr(MCInst *MI, SStream *O)
{
	switch (MCInst_getOpcode(MI)) {
		default: return false;
		case SP_JMPLrr:
		case SP_JMPLri:
				 if (MCInst_getNumOperands(MI) != 3)
					 return false;
				 if (!MCOperand_isReg(MCInst_getOperand(MI, 0)))
					 return false;

				 switch (MCOperand_getReg(MCInst_getOperand(MI, 0))) {
					 default: return false;
					 case SP_G0: // jmp $addr | ret | retl
							  if (MCOperand_isImm(MCInst_getOperand(MI, 2)) &&
									MCOperand_getImm(MCInst_getOperand(MI, 2)) == 8) {
								  switch(MCOperand_getReg(MCInst_getOperand(MI, 1))) {
									  default: break;
									  case SP_I7: SStream_concat0(O, "ret"); MCInst_setOpcodePub(MI, SPARC_INS_RET); return true;
									  case SP_O7: SStream_concat0(O, "retl"); MCInst_setOpcodePub(MI, SPARC_INS_RETL); return true;
								  }
							  }

							  SStream_concat0(O, "jmp\t");
							  MCInst_setOpcodePub(MI, SPARC_INS_JMP);
							  printMemOperand(MI, 1, O, NULL);
							  return true;
					 case SP_O7: // call $addr
							  SStream_concat0(O, "call ");
							  MCInst_setOpcodePub(MI, SPARC_INS_CALL);
							  printMemOperand(MI, 1, O, NULL);
							  return true;
				 }
		case SP_V9FCMPS:
		case SP_V9FCMPD:
		case SP_V9FCMPQ:
		case SP_V9FCMPES:
		case SP_V9FCMPED:
		case SP_V9FCMPEQ:
				 if (MI->csh->mode & CS_MODE_V9 || (MCInst_getNumOperands(MI) != 3) ||
						 (!MCOperand_isReg(MCInst_getOperand(MI, 0))) ||
						 (MCOperand_getReg(MCInst_getOperand(MI, 0)) != SP_FCC0))
						 return false;
				 // if V8, skip printing %fcc0.
				 switch(MCInst_getOpcode(MI)) {
					 default:
					 case SP_V9FCMPS:  SStream_concat0(O, "fcmps\t"); MCInst_setOpcodePub(MI, SPARC_INS_FCMPS); break;
					 case SP_V9FCMPD:  SStream_concat0(O, "fcmpd\t"); MCInst_setOpcodePub(MI, SPARC_INS_FCMPD); break;
					 case SP_V9FCMPQ:  SStream_concat0(O, "fcmpq\t"); MCInst_setOpcodePub(MI, SPARC_INS_FCMPQ); break;
					 case SP_V9FCMPES: SStream_concat0(O, "fcmpes\t"); MCInst_setOpcodePub(MI, SPARC_INS_FCMPES); break;
					 case SP_V9FCMPED: SStream_concat0(O, "fcmped\t"); MCInst_setOpcodePub(MI, SPARC_INS_FCMPED); break;
					 case SP_V9FCMPEQ: SStream_concat0(O, "fcmpeq\t"); MCInst_setOpcodePub(MI, SPARC_INS_FCMPEQ); break;
				 }
				 printOperand(MI, 1, O);
				 SStream_concat0(O, ", ");
				 printOperand(MI, 2, O);
				 return true;
	}
}